

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_MacProjector.cpp
# Opt level: O0

void __thiscall
Hydro::MacProjector::setDivU
          (MacProjector *this,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *a_divu)

{
  bool bVar1;
  Long LVar2;
  MultiFab **ppMVar3;
  MultiFab *pMVar4;
  MultiFab *in_RDI;
  int N;
  int ilev;
  char *in_stack_00000168;
  int in_stack_00000174;
  char *in_stack_00000178;
  char *in_stack_00000180;
  FabFactory<amrex::FArrayBox> *in_stack_ffffffffffffff48;
  Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *in_stack_ffffffffffffff50;
  BoxArray *in_stack_ffffffffffffff68;
  DistributionMapping *in_stack_ffffffffffffff70;
  MultiFab *in_stack_ffffffffffffff78;
  undefined1 local_68 [80];
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if (*(long *)((long)&(in_RDI->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_bat.
                       m_op + 0x3c) == 0) {
    in_stack_ffffffffffffffec = 0xae;
    local_68._72_8_ =
         "\"MacProjector::setDivU: initProjector must be called before calling this method\"";
    amrex::Assert_host(in_stack_00000180,in_stack_00000178,in_stack_00000174,in_stack_00000168);
  }
  local_68._52_4_ = 0;
  LVar2 = amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::size
                    ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                     0x74caa1);
  local_68._48_4_ = (undefined4)LVar2;
  for (; (int)local_68._52_4_ < (int)local_68._48_4_; local_68._52_4_ = local_68._52_4_ + 1) {
    ppMVar3 = amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
              operator[]((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          *)in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
    if (*ppMVar3 != (MultiFab *)0x0) {
      amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      bVar1 = amrex::FabArray<amrex::FArrayBox>::ok
                        ((FabArray<amrex::FArrayBox> *)
                         CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      if (!bVar1) {
        pMVar4 = amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                           (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        ppMVar3 = amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
                  operator[]((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                              *)in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff68 = amrex::FabArrayBase::boxArray((FabArrayBase *)*ppMVar3);
        ppMVar3 = amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::
                  operator[]((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                              *)in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff70 = amrex::FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar3);
        local_68._16_8_ = 0;
        local_68._24_8_ = 0;
        local_68._0_8_ = (_func_int **)0x0;
        local_68._8_8_ = 0;
        local_68._32_8_ = 0;
        in_stack_ffffffffffffff78 = (MultiFab *)local_68;
        amrex::MFInfo::MFInfo((MFInfo *)0x74cb8b);
        amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
                  ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                   in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff48 =
             amrex::FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x74cba8);
        (*(pMVar4->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
                  (pMVar4,in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,1,0,
                   in_stack_ffffffffffffff78);
        amrex::MFInfo::~MFInfo((MFInfo *)0x74cbe2);
      }
      amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::operator[]
                ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                 in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      amrex::MultiFab::Copy
                (in_RDI,in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                 (int)in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                 (int)in_stack_ffffffffffffff68);
    }
  }
  return;
}

Assistant:

void MacProjector::setDivU(const Vector<MultiFab const*>& a_divu)
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(
        m_linop != nullptr,
        "MacProjector::setDivU: initProjector must be called before calling this method");

    for (int ilev = 0, N = a_divu.size(); ilev < N; ++ilev) {
        if (a_divu[ilev]) {
            if (!m_divu[ilev].ok()) {
#ifdef AMREX_USE_EB
                m_divu[ilev].define(
                    a_divu[ilev]->boxArray(),
                    a_divu[ilev]->DistributionMap(),
                    1,0,MFInfo(), a_divu[ilev]->Factory());
#else
                m_divu[ilev].define(
                    a_divu[ilev]->boxArray(),
                    a_divu[ilev]->DistributionMap(), 1, 0);
#endif
            }
            MultiFab::Copy(m_divu[ilev], *a_divu[ilev], 0, 0, 1, 0);
        }
    }
}